

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_settablesize(FuncState *fs,int pc,int ra,int asize,int hsize)

{
  Instruction *pIVar1;
  int iVar2;
  uint uVar3;
  
  pIVar1 = fs->f->code;
  if (hsize == 0) {
    uVar3 = 0;
  }
  else {
    iVar2 = luaO_ceillog2(hsize);
    uVar3 = iVar2 * 0x10000 + 0x10000;
  }
  iVar2 = asize + 0xff;
  if (-1 < asize) {
    iVar2 = asize;
  }
  pIVar1[pc] = (uint)(0xff < asize) << 0xf | asize << 0x18 | ra << 7 | uVar3 | 0x13;
  pIVar1[(long)pc + 1] = (iVar2 >> 8) << 7 | 0x52;
  return;
}

Assistant:

void luaK_settablesize (FuncState *fs, int pc, int ra, int asize, int hsize) {
  Instruction *inst = &fs->f->code[pc];
  int rb = (hsize != 0) ? luaO_ceillog2(hsize) + 1 : 0;  /* hash size */
  int extra = asize / (MAXARG_C + 1);  /* higher bits of array size */
  int rc = asize % (MAXARG_C + 1);  /* lower bits of array size */
  int k = (extra > 0);  /* true iff needs extra argument */
  *inst = CREATE_ABCk(OP_NEWTABLE, ra, rb, rc, k);
  *(inst + 1) = CREATE_Ax(OP_EXTRAARG, extra);
}